

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

uint64_t rate_per_second(uint64_t value,uint64_t uptime_ns)

{
  uint64_t uptime_s;
  uint64_t billion;
  uint64_t uptime_ns_local;
  uint64_t value_local;
  undefined8 local_8;
  
  if ((uptime_ns == 0) || (value == 0)) {
    local_8 = 0;
  }
  else {
    local_8 = value;
    if (999999999 < uptime_ns) {
      local_8 = value / (uptime_ns / 1000000000);
    }
  }
  return local_8;
}

Assistant:

static uint64_t
rate_per_second(uint64_t value, uint64_t uptime_ns) {
	uint64_t billion = 1000000000;
	if (uptime_ns == 0 || value == 0) {
		return 0;
	}
	if (uptime_ns < billion) {
		return value;
	} else {
		uint64_t uptime_s = uptime_ns / billion;
		return value / uptime_s;
	}
}